

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O3

int __thiscall Clasp::DefaultUnfoundedCheck::init(DefaultUnfoundedCheck *this,EVP_PKEY_CTX *ctx)

{
  size_type sVar1;
  LitVec *pLVar2;
  void *pvVar3;
  pointer pAVar4;
  pointer pBVar5;
  bool bVar6;
  byte bVar7;
  UfsType UVar8;
  uint32 lower;
  MinimalityCheck *this_00;
  SolveParams *pSVar9;
  size_type sVar10;
  ulong unaff_RBP;
  ReasonStrategy rs;
  MinimalityCheck *pMVar11;
  uint uVar12;
  ulong uVar13;
  size_type i;
  size_type sVar14;
  long lVar15;
  byte bVar17;
  pointer pAVar18;
  Literal local_54;
  BodyPtr local_50;
  size_type local_3c;
  ulong local_38;
  ulong uVar16;
  
  pLVar2 = this->reasons_;
  if (pLVar2 != (LitVec *)0x0) {
    lVar15._0_4_ = pLVar2[-1].ebo_.size;
    lVar15._4_4_ = pLVar2[-1].ebo_.cap;
    if (lVar15 != 0) {
      lVar15 = lVar15 << 4;
      do {
        pvVar3 = *(void **)((long)&pLVar2[-1].ebo_.buf + lVar15);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3);
        }
        lVar15 = lVar15 + -0x10;
      } while (lVar15 != 0);
    }
    operator_delete__(&pLVar2[-1].ebo_.size);
  }
  this->reasons_ = (LitVec *)0x0;
  this->solver_ = (Solver *)ctx;
  rs = no_reason;
  if ((*(ulong *)(ctx + 0x70) >> 0x33 & 1) == 0) {
    rs = this->strategy_;
  }
  setReasonStrategy(this,rs);
  UVar8 = findUfs(this,(Solver *)ctx,false);
  if (UVar8 != ufs_none) {
    do {
      while (uVar12 = (this->ufs_).qFront, uVar12 != (this->ufs_).vec.ebo_.size) {
        local_54.rep_ =
             (this->graph_->atoms_).ebo_.buf[(this->ufs_).vec.ebo_.buf[uVar12]].super_Node.lit.rep_
             & 0xfffffffe ^ 2;
        local_50.node = (BodyNode *)0x0;
        bVar6 = Solver::force((Solver *)ctx,&local_54,(Antecedent *)&local_50);
        if (!bVar6) {
          return 0;
        }
        uVar12 = (this->ufs_).qFront;
        (this->ufs_).qFront = uVar12 + 1;
        pAVar4 = (this->atoms_).ebo_.buf + (this->ufs_).vec.ebo_.buf[uVar12];
        *pAVar4 = (AtomData)((uint)*pAVar4 & 0xbfffffff);
      }
      UVar8 = findUfs(this,(Solver *)ctx,false);
    } while (UVar8 != ufs_none);
  }
  local_38 = (ulong)(this->atoms_).ebo_.size;
  local_50.node = (BodyNode *)CONCAT44(local_50.node._4_4_,0x1fffffff);
  bk_lib::
  pod_vector<Clasp::DefaultUnfoundedCheck::AtomData,_std::allocator<Clasp::DefaultUnfoundedCheck::AtomData>_>
  ::resize(&this->atoms_,(this->graph_->atoms_).ebo_.size,(AtomData *)&local_50);
  pAVar4 = (this->atoms_).ebo_.buf;
  *pAVar4 = (AtomData)((uint)*pAVar4 | 0xe0000000);
  sVar10 = (this->bodies_).ebo_.size;
  if (sVar10 != (this->graph_->bodies_).ebo_.size) {
    do {
      local_50.node = (BodyNode *)((ulong)local_50.node & 0xffffffff00000000);
      bk_lib::
      pod_vector<Clasp::DefaultUnfoundedCheck::BodyData,_std::allocator<Clasp::DefaultUnfoundedCheck::BodyData>_>
      ::push_back(&this->bodies_,(BodyData *)&local_50);
      local_50.node = (this->graph_->bodies_).ebo_.buf + sVar10;
      local_50.id = sVar10;
      if ((((local_50.node)->super_Node).field_0x7 & 0x10) == 0) {
        pBVar5 = (this->bodies_).ebo_.buf;
        lower = Asp::PrgDepGraph::BodyNode::num_preds(local_50.node);
        pBVar5[sVar10].lower_or_ext = lower;
        initSuccessors(this,&local_50,lower);
      }
      else {
        initExtBody(this,&local_50);
      }
      Solver::addWatch(this->solver_,
                       (Literal)(((local_50.node)->super_Node).lit.rep_ & 0xfffffffe ^ 2),
                       (Constraint *)this,local_50.id << 2);
      sVar10 = sVar10 + 1;
      unaff_RBP = (ulong)sVar10;
    } while (sVar10 != (this->graph_->bodies_).ebo_.size);
  }
  propagateSource(this);
  uVar16 = local_38;
  local_3c = (this->atoms_).ebo_.size;
  sVar14 = (size_type)local_38;
  if (sVar14 != local_3c) {
    unaff_RBP = (ulong)(sVar14 * 4 + 1);
    uVar13 = local_38 & 0xffffffff;
    do {
      pAVar18 = (this->graph_->atoms_).ebo_.buf + uVar13;
      if (-1 < (int)(this->atoms_).ebo_.buf[uVar13]) {
        local_54.rep_ = (pAVar18->super_Node).lit.rep_ & 0xfffffffe ^ 2;
        local_50.node = (BodyNode *)0x0;
        bVar6 = Solver::force(this->solver_,&local_54,(Antecedent *)&local_50);
        if (!bVar6) {
          return 0;
        }
      }
      if (((pAVar18->super_Node).field_0x7 & 0x10) != 0) {
        Solver::addWatch(this->solver_,(Literal)((pAVar18->super_Node).lit.rep_ & 0xfffffffe ^ 2),
                         (Constraint *)this,(uint32)unaff_RBP);
      }
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
      unaff_RBP = (ulong)((uint32)unaff_RBP + 4);
    } while (local_3c != uVar12);
  }
  if ((this->graph_->components_).ebo_.size != 0) {
    this_00 = (MinimalityCheck *)operator_new(0x18);
    pSVar9 = Solver::searchConfig((Solver *)ctx);
    MinimalityCheck::MinimalityCheck(this_00,&pSVar9->fwdCheck);
    uVar13 = (this->mini_).ptr_;
    pMVar11 = (MinimalityCheck *)(uVar13 & 0xfffffffffffffffe);
    if ((uVar13 & 1) != 0 && this_00 != pMVar11) {
      (this->mini_).ptr_ = (uintp)pMVar11;
      operator_delete(pMVar11);
    }
    (this->mini_).ptr_ = (ulong)this_00 | 1;
    bVar7 = *(byte *)(((ulong)this_00 & 0xfffffffffffffffe) + 4);
    bVar17 = bVar7 & 3;
    if ((bVar7 & 3) != 0) {
      sVar1 = (this->atoms_).ebo_.size;
      while (sVar14 != sVar1) {
        pAVar18 = (this->graph_->atoms_).ebo_.buf;
        if ((pAVar18[uVar16 & 0xffffffff].super_Node.field_0x7 & 0x20) != 0) {
          uVar12 = pAVar18[uVar16 & 0xffffffff].super_Node.lit.rep_;
          if ((*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                        (ulong)(uVar12 & 0xfffffffc)) & 3) == 0) {
            bVar7 = ((uVar12 & 2) == 0) + 1;
            if ((bVar17 == 1) || ((bVar17 == 3 && ((uVar16 & 1) != 0)))) {
              bVar7 = bVar7 ^ 3;
            }
            Solver::setPref(this->solver_,uVar12 >> 2,def_value,bVar7);
          }
        }
        sVar14 = (int)uVar16 + 1;
        uVar16 = (ulong)sVar14;
      }
    }
  }
  return (int)CONCAT71((int7)(unaff_RBP >> 8),1);
}

Assistant:

bool DefaultUnfoundedCheck::init(Solver& s) {
	assert(!solver_ || solver_ == &s);
	delete[] reasons_;
	reasons_ = 0;
	solver_  = &s;
	setReasonStrategy(s.searchMode() != SolverStrategies::no_learning ? strategy_ : no_reason);
	// process any leftovers from previous steps
	while (findUfs(s, false) != ufs_none) {
		while (!ufs_.empty()) {
			if (!s.force(~graph_->getAtom(ufs_.front()).lit, 0)) { return false; }
			atoms_[ufs_.pop_ret()].ufs = 0;
		}
	}
	AtomVec::size_type startAtom = atoms_.size();
	// set up new atoms
	atoms_.resize(graph_->numAtoms());
	AtomData& sentinel = atoms_[DependencyGraph::sentinel_atom];
	sentinel.resurrectSource();
	sentinel.todo = 1;
	sentinel.ufs  = 1;
	// set up new bodies
	for (uint32 i = (uint32)bodies_.size(); i != graph_->numBodies(); ++i) {
		bodies_.push_back(BodyData());
		BodyPtr n(getBody(i));
		if (!n.node->extended()) {
			initBody(n);
		}
		else {
			initExtBody(n);
		}
		// when a body becomes false, it can no longer be used as source
		addWatch(~n.node->lit, n.id, watch_source_false);
	}
	// check for initially unfounded atoms
	propagateSource();
	for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
		const AtomNode& a = graph_->getAtom(NodeId(i));
		if (!atoms_[i].hasSource() && !solver_->force(~a.lit, 0)) {
			return false;
		}
		if (a.inChoice()) {
			addWatch(~a.lit, NodeId(i), watch_head_false);
		}
	}
	if (graph_->numNonHcfs() != 0) {
		mini_ = new MinimalityCheck(s.searchConfig().fwdCheck);
		if (const uint32 sd = mini_->fwd.signDef) {
			for (AtomVec::size_type i = startAtom, end = atoms_.size(); i != end; ++i) {
				const AtomNode& a = graph_->getAtom(NodeId(i));
				if (a.inDisjunctive() && solver_->value(a.lit.var()) == value_free) {
					ValueRep v = falseValue(a.lit);
					if (sd == SolverStrategies::sign_pos || (sd == SolverStrategies::sign_rnd && (i & 1) != 0)) {
						v ^= static_cast<ValueRep>(3u);
					}
					solver_->setPref(a.lit.var(), ValueSet::def_value, v);
				}
			}
		}
	}
	return true;
}